

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

string * __thiscall
GrcSymbolTableEntry::FullAbbrevOmit
          (string *__return_storage_ptr__,GrcSymbolTableEntry *this,string *staOmit)

{
  __type _Var1;
  Symbol pGVar2;
  string staTmp;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)this);
  Abbreviation(__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pGVar2 = this->m_psymtbl->m_psymParent;
  do {
    if (pGVar2 == (Symbol)0x0) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_90,(string *)pGVar2);
    Abbreviation(&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    _Var1 = std::operator==(&local_70,staOmit);
    if (!_Var1) {
      std::__cxx11::string::append((char *)&local_70);
      std::__cxx11::string::append((string *)&local_70);
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      pGVar2 = pGVar2->m_psymtbl->m_psymParent;
    }
    std::__cxx11::string::~string((string *)&local_70);
  } while (!_Var1);
  return __return_storage_ptr__;
}

Assistant:

std::string GrcSymbolTableEntry::FullAbbrevOmit(std::string staOmit)
{
	std::string staRet = Abbreviation(m_staFieldName);
	GrcSymbolTableEntry * psymCurr = m_psymtbl->m_psymParent;
	while (psymCurr)
	{
		std::string staTmp = Abbreviation(psymCurr->m_staFieldName);
		if (staTmp == staOmit)
			break;
		staTmp += ".";
		staTmp += staRet;
		staRet = staTmp;
		psymCurr = psymCurr->m_psymtbl->m_psymParent;
	}
	return staRet;
}